

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O1

ResourceAttribution * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
GetResourceAttribution<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>>
          (ResourceAttribution *__return_storage_ptr__,
          PipelineStateBase<Diligent::EngineVkImplTraits> *this,char *Name,SHADER_TYPE Stage,
          RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *pSignatures,Uint32 SignCount)

{
  PipelineResourceSignatureImplType *_pSignature;
  bool bVar1;
  Uint32 _ResourceIndex;
  Uint32 _ImmutableSamplerIndex;
  undefined4 in_register_0000000c;
  ulong uVar2;
  bool bVar3;
  string msg;
  string local_50;
  
  if ((this == (PipelineStateBase<Diligent::EngineVkImplTraits> *)0x0) ||
     (*(char *)&(this->
                super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                ).super_ObjectBase<Diligent::IPipelineStateVk>.
                super_RefCountedObject<Diligent::IPipelineStateVk>.super_IPipelineStateVk.
                super_IPipelineState.super_IDeviceObject.super_IObject == '\0')) {
    FormatString<char[26],char[35]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",
               (char (*) [35])CONCAT44(in_register_0000000c,Stage));
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"GetResourceAttribution",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x45a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar3 = (int)pSignatures != 0;
  if (bVar3) {
    uVar2 = 0;
    do {
      _pSignature = *(PipelineResourceSignatureImplType **)
                     (*(char (*) [35])CONCAT44(in_register_0000000c,Stage) + uVar2 * 8);
      if (_pSignature == (PipelineResourceSignatureImplType *)0x0) {
        bVar1 = false;
      }
      else {
        _ResourceIndex =
             FindResource((_pSignature->
                          super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          .m_Desc.Resources,
                          (_pSignature->
                          super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          .m_Desc.NumResources,(SHADER_TYPE)Name,(char *)this);
        if (_ResourceIndex == 0xffffffff) {
          _ImmutableSamplerIndex =
               FindImmutableSampler
                         ((_pSignature->
                          super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          .m_Desc.ImmutableSamplers,
                          (_pSignature->
                          super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          .m_Desc.NumImmutableSamplers,(SHADER_TYPE)Name,(char *)this,
                          (_pSignature->
                          super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                          .m_Desc.CombinedSamplerSuffix);
          if (_ImmutableSamplerIndex == 0xffffffff) {
            bVar1 = false;
            goto LAB_00210d9d;
          }
          _ResourceIndex = 0xffffffff;
        }
        else {
          _ImmutableSamplerIndex = 0xffffffff;
        }
        ResourceAttribution::ResourceAttribution
                  (__return_storage_ptr__,_pSignature,(Uint32)uVar2,_ResourceIndex,
                   _ImmutableSamplerIndex);
        bVar1 = true;
      }
LAB_00210d9d:
      if (bVar1) {
        if (bVar3) {
          return __return_storage_ptr__;
        }
        break;
      }
      uVar2 = uVar2 + 1;
      bVar3 = uVar2 < ((ulong)pSignatures & 0xffffffff);
    } while (uVar2 != ((ulong)pSignatures & 0xffffffff));
  }
  __return_storage_ptr__->pSignature = (PipelineResourceSignatureImplType *)0x0;
  __return_storage_ptr__->SignatureIndex = 0xffffffff;
  __return_storage_ptr__->ResourceIndex = 0xffffffff;
  __return_storage_ptr__->ImmutableSamplerIndex = 0xffffffff;
  return __return_storage_ptr__;
}

Assistant:

static ResourceAttribution GetResourceAttribution(const char*                                Name,
                                                      SHADER_TYPE                                Stage,
                                                      const PipelineResourceSignatureImplPtrType pSignatures[],
                                                      Uint32                                     SignCount)
    {
        VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
        for (Uint32 sign = 0; sign < SignCount; ++sign)
        {
            const PipelineResourceSignatureImplType* const pSignature = pSignatures[sign];
            if (pSignature == nullptr)
                continue;

            const Uint32 ResIndex = pSignature->FindResource(Stage, Name);
            if (ResIndex != ResourceAttribution::InvalidResourceIndex)
                return ResourceAttribution{pSignature, sign, ResIndex};
            else
            {
                const Uint32 ImtblSamIndex = pSignature->FindImmutableSampler(Stage, Name);
                if (ImtblSamIndex != ResourceAttribution::InvalidSamplerIndex)
                    return ResourceAttribution{pSignature, sign, ResourceAttribution::InvalidResourceIndex, ImtblSamIndex};
            }
        }
        return ResourceAttribution{};
    }